

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcc.cpp
# Opt level: O3

void __thiscall RCCResourceLibrary::writeNumber4(RCCResourceLibrary *this,quint32 number)

{
  char cVar1;
  
  if (this->m_format == Binary) {
    cVar1 = (char)this + -0x20;
    QByteArray::append(cVar1);
    QByteArray::append(cVar1);
    QByteArray::append(cVar1);
    QByteArray::append(cVar1);
    return;
  }
  if (this->m_format == Pass2) {
    QIODevice::putChar((char)this->m_outDevice);
    QIODevice::putChar((char)this->m_outDevice);
    QIODevice::putChar((char)this->m_outDevice);
    QIODevice::putChar((char)this->m_outDevice);
    return;
  }
  writeHex(this,(quint8)(number >> 0x18));
  writeHex(this,(quint8)(number >> 0x10));
  writeHex(this,(quint8)(number >> 8));
  writeHex(this,(quint8)number);
  return;
}

Assistant:

void RCCResourceLibrary::writeNumber4(quint32 number)
{
    if (m_format == RCCResourceLibrary::Pass2) {
        m_outDevice->putChar(char(number >> 24));
        m_outDevice->putChar(char(number >> 16));
        m_outDevice->putChar(char(number >> 8));
        m_outDevice->putChar(char(number));
    } else if (m_format == RCCResourceLibrary::Binary) {
        writeChar(number >> 24);
        writeChar(number >> 16);
        writeChar(number >> 8);
        writeChar(number);
    } else {
        writeHex(number >> 24);
        writeHex(number >> 16);
        writeHex(number >> 8);
        writeHex(number);
    }
}